

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::replace_reduction_with_global_pooling(NetOptimize *this)

{
  int iVar1;
  FILE *__stream;
  Layer *pLVar2;
  bool bVar3;
  vector<int,_std::allocator<int>_> *this_00;
  reference ppLVar4;
  reference pvVar5;
  size_type sVar6;
  ParamDict *this_01;
  undefined8 uVar7;
  reference pvVar8;
  long in_RDI;
  int bottom_blob_index_final;
  ParamDict pd;
  Pooling *pooling;
  int *axes2_ptr;
  Reduction *reduction2;
  size_t j;
  int top_blob_index;
  int *axes_ptr;
  Reduction *reduction1;
  size_t i;
  size_t layer_count;
  char *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  undefined1 local_60 [16];
  Layer *local_50;
  int *local_48;
  value_type local_40;
  vector<int,_std::allocator<int>_> *local_38;
  value_type local_2c;
  int *local_28;
  value_type local_20;
  vector<int,_std::allocator<int>_> *__x;
  
  this_00 = (vector<int,_std::allocator<int>_> *)
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58));
  __x = (vector<int,_std::allocator<int>_> *)0x0;
  do {
    if (this_00 <= __x) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
               (size_type)__x);
    bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            in_stack_ffffffffffffff48);
    if (!bVar3) {
      ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                            (in_RDI + 0x58),(size_type)__x);
      local_20 = *ppLVar4;
      if ((((*(int *)&local_20[1]._vptr_Layer == 3) &&
           (*(int *)((long)&local_20[1]._vptr_Layer + 4) == 0)) &&
          (*(float *)&local_20[1].one_blob_only == 1.0)) &&
         (((!NAN(*(float *)&local_20[1].one_blob_only) &&
           (*(int *)((long)&local_20[1].type._M_string_length + 4) == 1)) &&
          ((local_28 = ncnn::Mat::operator_cast_to_int_((Mat *)&local_20[1].support_tensor_storage),
           *local_28 == 2 || (*local_28 == 3)))))) {
        ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),(size_type)__x);
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar4)->tops,0);
        local_2c = *pvVar5;
        local_38 = __x;
        do {
          do {
            do {
              local_38 = (vector<int,_std::allocator<int>_> *)
                         ((long)&(local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start + 1);
              if (this_00 <= local_38) goto LAB_0015d002;
              std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                         (size_type)local_38);
              bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_ffffffffffffff54,
                                                  in_stack_ffffffffffffff50),
                                      in_stack_ffffffffffffff48);
            } while (bVar3);
            ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                  (in_RDI + 0x58),(size_type)local_38);
            sVar6 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar4)->bottoms);
          } while (sVar6 != 1);
          ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),(size_type)local_38);
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar4)->bottoms,0);
        } while (*pvVar5 != local_2c);
LAB_0015d002:
        if (local_38 != this_00) {
          ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),(size_type)local_38);
          local_40 = *ppLVar4;
          if (((*(int *)&local_40[1]._vptr_Layer == 3) &&
              (*(int *)((long)&local_40[1]._vptr_Layer + 4) == 0)) &&
             ((*(float *)&local_40[1].one_blob_only == 1.0 &&
              (((!NAN(*(float *)&local_40[1].one_blob_only) &&
                (*(int *)((long)&local_40[1].type._M_string_length + 4) == 1)) &&
               (local_48 = ncnn::Mat::operator_cast_to_int_
                                     ((Mat *)&local_40[1].support_tensor_storage),
               __stream = _stderr, *local_48 == 2)))))) {
            this_01 = (ParamDict *)std::__cxx11::string::c_str();
            uVar7 = std::__cxx11::string::c_str();
            fprintf(__stream,"replace_reduction_with_global_pooling %s %s\n",this_01,uVar7);
            local_50 = ncnn::create_layer(in_stack_ffffffffffffff48);
            std::__cxx11::string::operator=((string *)&local_50->type,"Pooling");
            std::__cxx11::string::operator=((string *)&local_50->name,(string *)&local_40->name);
            std::vector<int,_std::allocator<int>_>::operator=(this_00,__x);
            std::vector<int,_std::allocator<int>_>::operator=(this_00,__x);
            ncnn::ParamDict::ParamDict(this_01);
            (*local_50->_vptr_Layer[2])(local_50,local_60);
            pLVar2 = local_50;
            *(undefined4 *)&local_50[1]._vptr_Layer = 1;
            *(undefined4 *)((long)&local_50[1].userdata + 4) = 1;
            ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                  (in_RDI + 0x58),(size_type)local_38);
            *ppLVar4 = pLVar2;
            if (local_40 != (value_type)0x0) {
              (*local_40->_vptr_Layer[1])();
            }
            in_stack_ffffffffffffff48 = (char *)0x0;
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_20->bottoms,0);
            iVar1 = *pvVar5;
            in_stack_ffffffffffffff50 = iVar1;
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&local_50->bottoms,(size_type)in_stack_ffffffffffffff48);
            *pvVar5 = in_stack_ffffffffffffff50;
            in_stack_ffffffffffffff54 = (int)local_38;
            pvVar8 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                               (*(vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> **)(in_RDI + 0x50)
                                ,(long)iVar1);
            pvVar8->consumer = in_stack_ffffffffffffff54;
            std::__cxx11::string::operator=((string *)&local_20->type,"ncnnfused");
            ncnn::ParamDict::~ParamDict
                      ((ParamDict *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
          }
        }
      }
    }
    __x = (vector<int,_std::allocator<int>_> *)
          ((long)&(__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start + 1);
  } while( true );
}

Assistant:

int NetOptimize::replace_reduction_with_global_pooling()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Reduction")
            continue;

        ncnn::Reduction* reduction1 = (ncnn::Reduction*)layers[i];
        if (reduction1->operation != 3 || reduction1->reduce_all != 0 || reduction1->coeff != 1.f)
            continue;

        if (reduction1->axes.w != 1)
            continue;

        const int* axes_ptr = reduction1->axes;
        if (axes_ptr[0] != 2 && axes_ptr[0] != 3)
            continue;

        // Reduction(2/3) - Reduction(2)
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "Reduction")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::Reduction* reduction2 = (ncnn::Reduction*)layers[j];
        if (reduction2->operation != 3 || reduction2->reduce_all != 0 || reduction2->coeff != 1.f)
            continue;

        if (reduction2->axes.w != 1)
            continue;

        const int* axes2_ptr = reduction2->axes;
        if (axes2_ptr[0] != 2)
            continue;

        fprintf(stderr, "replace_reduction_with_global_pooling %s %s\n", reduction1->name.c_str(), reduction2->name.c_str());

        ncnn::Pooling* pooling = (ncnn::Pooling*)ncnn::create_layer("Pooling");

        pooling->type = "Pooling";
        pooling->name = reduction2->name;
        pooling->bottoms = reduction2->bottoms;
        pooling->tops = reduction2->tops;

        ncnn::ParamDict pd;
        pooling->load_param(pd);

        pooling->pooling_type = 1;
        pooling->global_pooling = 1;

        layers[j] = pooling;
        delete reduction2;

        int bottom_blob_index_final = reduction1->bottoms[0];
        pooling->bottoms[0] = bottom_blob_index_final;
        blobs[bottom_blob_index_final].consumer = j;
        reduction1->type = "ncnnfused";
    }

    return 0;
}